

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
S2RegionTermIndexer::GetIndexTerms_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,S2RegionTermIndexer *this,S2Region *region,string_view prefix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  S2CellUnion covering;
  S2CellUnion SStack_48;
  
  iVar1 = (this->options_).super_Options.min_level_;
  iVar2 = (this->options_).super_Options.max_level_;
  iVar3 = (this->options_).super_Options.level_mod_;
  (this->coverer_).options_.max_cells_ = (this->options_).super_Options.max_cells_;
  (this->coverer_).options_.min_level_ = iVar1;
  (this->coverer_).options_.max_level_ = iVar2;
  (this->coverer_).options_.level_mod_ = iVar3;
  S2RegionCoverer::GetCovering(&SStack_48,&this->coverer_,region);
  GetIndexTermsForCanonicalCovering_abi_cxx11_(__return_storage_ptr__,this,&SStack_48,prefix);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
            (&SStack_48.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<string> S2RegionTermIndexer::GetIndexTerms(const S2Region& region,
                                                  string_view prefix) {
  // Note that options may have changed since the last call.
  *coverer_.mutable_options() = options_;
  S2CellUnion covering = coverer_.GetCovering(region);
  return GetIndexTermsForCanonicalCovering(covering, prefix);
}